

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O1

void __thiscall
ExecutorTest_LambdaCallFromVar_Test::~ExecutorTest_LambdaCallFromVar_Test
          (ExecutorTest_LambdaCallFromVar_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, LambdaCallFromVar)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let f: function = \(y: f32, z: f32): f32 = { ret y + z; };
    print("" : f(2, 2));
    ret 0;
  }
  )SRC";

  std::string expected = "4.000000\n";

  testProgram(source, expected, 0);
}